

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyValueInt64(JSContext *ctx,JSValue this_obj,int64_t idx,JSValue val,int flags)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  bool bVar4;
  JSValue prop;
  JSValue val_local;
  
  bVar4 = (int)idx == idx;
  JVar2.float64 = (double)idx;
  if (bVar4) {
    JVar2.ptr = (void *)(idx & 0xffffffff);
  }
  iVar3 = 7;
  if (bVar4) {
    iVar3 = 0;
  }
  prop.tag = iVar3;
  prop.u.float64 = JVar2.float64;
  iVar1 = JS_DefinePropertyValueValue(ctx,this_obj,prop,val,flags);
  return iVar1;
}

Assistant:

int JS_DefinePropertyValueInt64(JSContext *ctx, JSValueConst this_obj,
                                int64_t idx, JSValue val, int flags)
{
    return JS_DefinePropertyValueValue(ctx, this_obj, JS_NewInt64(ctx, idx),
                                       val, flags);
}